

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  undefined8 uVar5;
  long lVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  int *piVar11;
  int *mEnd;
  BYTE *pBVar12;
  ulong uVar13;
  int *piVar14;
  uint uVar15;
  BYTE *pBVar16;
  U32 UVar17;
  int iVar18;
  long lVar19;
  int *piVar20;
  size_t sVar21;
  int *piVar22;
  seqDef *psVar23;
  size_t offset2;
  uint local_e8;
  uint local_e4;
  size_t local_b8;
  int *local_b0;
  BYTE *local_a8;
  BYTE *local_a0;
  uint local_94;
  BYTE *local_90;
  int *local_88;
  int *local_80;
  ZSTD_matchState_t *local_78;
  uint *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  BYTE *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  local_a8 = pBVar3 + uVar2;
  local_e4 = *rep;
  pZVar4 = ms->dictMatchState;
  local_b0 = (int *)(pZVar4->window).nextSrc;
  local_a0 = (pZVar4->window).base;
  local_50 = local_a0 + (pZVar4->window).dictLimit;
  iVar18 = (int)local_b0;
  uVar7 = ((int)src - ((int)local_a8 + (int)local_50)) + iVar18;
  local_78 = ms;
  if (uVar7 < local_e4) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417a,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  piVar20 = (int *)((long)src + (ulong)(uVar7 == 0));
  local_e8 = rep[1];
  if (uVar7 < local_e8) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417b,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  piVar11 = (int *)((long)src + (srcSize - 8));
  if (piVar20 < piVar11) {
    local_94 = ((int)local_a0 - iVar18) + uVar2;
    local_90 = local_a0 + -(ulong)local_94;
    local_88 = iEnd + -8;
    iVar10 = (int)pBVar3;
    local_58 = (ulong)((1 - uVar2) - iVar10);
    local_60 = (ulong)(uint)-iVar10;
    local_68 = (ulong)((((iVar18 - uVar2) - (int)local_a0) - iVar10) + 1);
    local_70 = rep;
    do {
      iVar18 = (int)piVar20;
      uVar7 = ((iVar18 - iVar10) - local_e4) + 1;
      piVar22 = (int *)(pBVar3 + uVar7);
      if (uVar7 < uVar2) {
        piVar22 = (int *)(local_a0 + (uVar7 - local_94));
      }
      if ((uVar7 - uVar2 < 0xfffffffd) && (*piVar22 == *(int *)((long)piVar20 + 1))) {
        piVar14 = iEnd;
        if (uVar7 < uVar2) {
          piVar14 = local_b0;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar20 + 5),(BYTE *)(piVar22 + 1),(BYTE *)iEnd,
                           (BYTE *)piVar14,local_a8);
        uVar13 = sVar8 + 4;
      }
      else {
        uVar13 = 0;
      }
      local_b8 = 999999999;
      sVar8 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                        (local_78,(BYTE *)piVar20,(BYTE *)iEnd,&local_b8);
      uVar9 = uVar13;
      if (uVar13 < sVar8) {
        uVar9 = sVar8;
      }
      if (uVar9 < 4) {
        piVar20 = (int *)((long)piVar20 + ((long)piVar20 - (long)src >> 8) + 1);
      }
      else {
        piVar22 = piVar20;
        sVar21 = local_b8;
        if (sVar8 <= uVar13) {
          piVar22 = (int *)((long)piVar20 + 1);
          sVar21 = 0;
        }
        uVar13 = uVar9;
        if (piVar20 < piVar11) {
          local_38 = (ulong)(((int)local_58 + iVar18) - local_e4);
          local_40 = (ulong)(((int)local_60 + iVar18) - local_e4);
          local_48 = (ulong)(((int)local_68 + iVar18) - local_e4);
          lVar19 = 0;
          local_80 = piVar20;
          do {
            piVar14 = (int *)((long)local_80 + lVar19 + 1);
            iVar18 = (int)lVar19;
            uVar7 = (int)local_40 + iVar18 + 1;
            piVar20 = (int *)(pBVar3 + uVar7);
            if (uVar7 < uVar2) {
              piVar20 = (int *)(local_a0 + (uint)((int)local_48 + iVar18));
            }
            uVar13 = uVar9;
            if (((uint)((int)local_38 + iVar18) < 0xfffffffd) && (*piVar20 == *piVar14)) {
              mEnd = iEnd;
              if (uVar7 < uVar2) {
                mEnd = local_b0;
              }
              sVar8 = ZSTD_count_2segments
                                ((BYTE *)((long)local_80 + lVar19 + 5),(BYTE *)(piVar20 + 1),
                                 (BYTE *)iEnd,(BYTE *)mEnd,local_a8);
              uVar7 = (int)sVar21 + 1;
              if (uVar7 == 0) goto LAB_00140071;
              if (sVar8 < 0xfffffffffffffffc) {
                uVar15 = 0x1f;
                if (uVar7 != 0) {
                  for (; uVar7 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                  }
                }
                if ((int)((uVar15 ^ 0x1f) + (int)uVar9 * 3 + -0x1e) < (int)(sVar8 + 4) * 3) {
                  sVar21 = 0;
                  piVar22 = piVar14;
                  uVar13 = sVar8 + 4;
                }
              }
            }
            local_b8 = 999999999;
            uVar9 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                              (local_78,(BYTE *)piVar14,(BYTE *)iEnd,&local_b8);
            uVar7 = (int)local_b8 + 1;
            if ((uVar7 == 0) || (uVar15 = (int)sVar21 + 1, uVar15 == 0)) {
LAB_00140071:
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x12c2,"U32 ZSTD_highbit32(U32)");
            }
            if (uVar9 < 4) goto LAB_0013fcb4;
            iVar18 = 0x1f;
            if (uVar7 != 0) {
              for (; uVar7 >> iVar18 == 0; iVar18 = iVar18 + -1) {
              }
            }
            uVar7 = 0x1f;
            if (uVar15 != 0) {
              for (; uVar15 >> uVar7 == 0; uVar7 = uVar7 - 1) {
              }
            }
            if ((int)uVar9 * 4 - iVar18 <= (int)((uVar7 ^ 0x1f) + (int)uVar13 * 4 + -0x1b))
            goto LAB_0013fcb4;
            lVar6 = lVar19 + 1;
            lVar19 = lVar19 + 1;
            piVar22 = piVar14;
            sVar21 = local_b8;
          } while ((int *)((long)local_80 + lVar6) < piVar11);
          piVar22 = (int *)((long)local_80 + lVar19);
          uVar13 = uVar9;
        }
LAB_0013fcb4:
        if (sVar21 == 0) {
          UVar17 = 1;
        }
        else {
          uVar9 = (long)piVar22 + (-(long)pBVar3 - sVar21) + -0xfffffffe;
          pBVar12 = pBVar3;
          pBVar16 = local_a8;
          if ((uint)uVar9 < uVar2) {
            pBVar12 = local_90;
            pBVar16 = local_50;
          }
          if ((src < piVar22) && (uVar9 = uVar9 & 0xffffffff, pBVar16 < pBVar12 + uVar9)) {
            pBVar12 = pBVar12 + uVar9;
            do {
              piVar20 = (int *)((long)piVar22 + -1);
              pBVar12 = pBVar12 + -1;
              if ((*(BYTE *)piVar20 != *pBVar12) ||
                 (uVar13 = uVar13 + 1, piVar22 = piVar20, piVar20 <= src)) break;
            } while (pBVar16 < pBVar12);
          }
          UVar17 = (int)sVar21 + 1;
          local_e8 = local_e4;
          local_e4 = (int)sVar21 - 2;
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001400ed:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_001400ce:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar9 = (long)piVar22 - (long)src;
        pBVar16 = seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < pBVar16 + uVar9) {
LAB_00140090:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < piVar22) {
LAB_001400af:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_88 < piVar22) {
          ZSTD_safecopyLiterals(pBVar16,(BYTE *)src,(BYTE *)piVar22,(BYTE *)local_88);
LAB_0013fdc0:
          seqStore->lit = seqStore->lit + uVar9;
          if (0xffff < uVar9) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar5 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar16 = *src;
          *(undefined8 *)(pBVar16 + 8) = uVar5;
          pBVar16 = seqStore->lit;
          if (0x10 < uVar9) {
            lVar19 = (long)(pBVar16 + 0x10) - ((long)src + 0x10);
            if (lVar19 < 8) {
              if (-0x10 < lVar19) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
            }
            else if (0xffffffffffffffe0 < lVar19 - 0x10U) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar5 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar16 + 0x18) = uVar5;
            if (0x20 < (long)uVar9) {
              lVar19 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar19 + 0x20);
                uVar5 = puVar1[1];
                pBVar12 = pBVar16 + lVar19 + 0x20;
                *(undefined8 *)pBVar12 = *puVar1;
                *(undefined8 *)(pBVar12 + 8) = uVar5;
                puVar1 = (undefined8 *)((long)src + lVar19 + 0x30);
                uVar5 = puVar1[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar12 + 0x18) = uVar5;
                lVar19 = lVar19 + 0x20;
              } while (pBVar12 + 0x20 < pBVar16 + uVar9);
            }
            goto LAB_0013fdc0;
          }
          seqStore->lit = pBVar16 + uVar9;
        }
        psVar23 = seqStore->sequences;
        psVar23->litLength = (U16)uVar9;
        psVar23->offset = UVar17;
        if (0xffff < uVar13 - 3) {
          if (seqStore->longLengthID != 0) {
LAB_0014010c:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar23->matchLength = (U16)(uVar13 - 3);
        psVar23 = psVar23 + 1;
        seqStore->sequences = psVar23;
        uVar7 = local_e8;
        for (piVar20 = (int *)((long)piVar22 + uVar13); local_e8 = uVar7, src = piVar20,
            piVar20 <= piVar11; piVar20 = (int *)((long)piVar20 + sVar8 + 4)) {
          uVar7 = ((int)piVar20 - iVar10) - local_e8;
          pBVar16 = pBVar3;
          if (uVar7 < uVar2) {
            pBVar16 = local_90;
          }
          if ((0xfffffffc < uVar7 - uVar2) || (*(int *)(pBVar16 + uVar7) != *piVar20)) break;
          piVar22 = iEnd;
          if (uVar7 < uVar2) {
            piVar22 = local_b0;
          }
          sVar8 = ZSTD_count_2segments
                            ((BYTE *)(piVar20 + 1),(BYTE *)((long)(pBVar16 + uVar7) + 4),
                             (BYTE *)iEnd,(BYTE *)piVar22,local_a8);
          if (seqStore->maxNbSeq <= (ulong)((long)psVar23 - (long)seqStore->sequencesStart >> 3))
          goto LAB_001400ed;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001400ce;
          pBVar16 = seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < pBVar16) goto LAB_00140090;
          if (iEnd < piVar20) goto LAB_001400af;
          if (local_88 < piVar20) {
            ZSTD_safecopyLiterals(pBVar16,(BYTE *)piVar20,(BYTE *)piVar20,(BYTE *)local_88);
          }
          else {
            uVar5 = *(undefined8 *)(piVar20 + 2);
            *(undefined8 *)pBVar16 = *(undefined8 *)piVar20;
            *(undefined8 *)(pBVar16 + 8) = uVar5;
          }
          psVar23 = seqStore->sequences;
          psVar23->litLength = 0;
          psVar23->offset = 1;
          if (0xffff < sVar8 + 1) {
            if (seqStore->longLengthID != 0) goto LAB_0014010c;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar23->matchLength = (U16)(sVar8 + 1);
          psVar23 = psVar23 + 1;
          seqStore->sequences = psVar23;
          uVar7 = local_e4;
          local_e4 = local_e8;
        }
      }
      rep = local_70;
    } while (piVar20 < piVar11);
  }
  *rep = local_e4;
  rep[1] = local_e8;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_dictMatchState);
}